

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

Mat * __thiscall ncnn::Mat::channel(Mat *this,int _c)

{
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  Mat *m;
  void *in_stack_ffffffffffffffc8;
  Mat *pMVar1;
  int _w;
  
  if (in_RSI->dims == 3) {
    Mat(in_RDI,in_RSI->w,in_RSI->h,
        (void *)((long)in_RSI->data + in_RSI->cstep * (long)in_EDX * in_RSI->elemsize),
        in_RSI->elemsize,in_RSI->elempack,in_RSI->allocator);
    pMVar1 = in_RDI;
  }
  else {
    _w = (int)((ulong)in_RDI >> 0x20);
    pMVar1 = in_RDI;
    Mat(in_RSI,_w,(int)in_RDI,_w,in_stack_ffffffffffffffc8,(size_t)in_RSI->allocator,(int)in_RSI,
        (Allocator *)in_RDI);
    in_RDI->cstep = (long)in_RSI->w * (long)in_RSI->h;
  }
  return pMVar1;
}

Assistant:

inline Mat Mat::channel(int _c)
{
    if (dims == 3)
        return Mat(w, h, (unsigned char*)data + cstep * _c * elemsize, elemsize, elempack, allocator);

    // if (dims == 4)
    Mat m(w, h, d, (unsigned char*)data + cstep * _c * elemsize, elemsize, elempack, allocator);
    m.cstep = (size_t)w * h;
    return m;
}